

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCVS.cxx
# Opt level: O3

void __thiscall cmCTestCVS::UpdateParser::~UpdateParser(UpdateParser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  pointer pcVar3;
  
  (this->super_LineParser).super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__UpdateParser_006b6850;
  pcVar2 = (this->RegexFileRemoved2).program;
  if (pcVar2 != (char *)0x0) {
    operator_delete__(pcVar2);
  }
  pcVar2 = (this->RegexFileRemoved1).program;
  if (pcVar2 != (char *)0x0) {
    operator_delete__(pcVar2);
  }
  pcVar2 = (this->RegexFileConflicting).program;
  if (pcVar2 != (char *)0x0) {
    operator_delete__(pcVar2);
  }
  pcVar2 = (this->RegexFileModified).program;
  if (pcVar2 != (char *)0x0) {
    operator_delete__(pcVar2);
  }
  pcVar2 = (this->RegexFileUpdated).program;
  if (pcVar2 != (char *)0x0) {
    operator_delete__(pcVar2);
  }
  (this->super_LineParser).super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LineParser_006b87c0;
  pcVar3 = (this->super_LineParser).Line._M_dataplus._M_p;
  paVar1 = &(this->super_LineParser).Line.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x458);
  return;
}

Assistant:

UpdateParser(cmCTestCVS* cvs, const char* prefix): CVS(cvs)
    {
    this->SetLog(&cvs->Log, prefix);
    // See "man cvs", section "update output".
    this->RegexFileUpdated.compile("^([UP])  *(.*)");
    this->RegexFileModified.compile("^([MRA])  *(.*)");
    this->RegexFileConflicting.compile("^([C])  *(.*)");
    this->RegexFileRemoved1.compile(
      "cvs[^ ]* update: `?([^']*)'? is no longer in the repository");
    this->RegexFileRemoved2.compile(
      "cvs[^ ]* update: "
      "warning: `?([^']*)'? is not \\(any longer\\) pertinent");
    }